

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

void __thiscall cmFileAPI::ReadClientQuery(cmFileAPI *this,string *client,ClientQueryJson *q)

{
  bool bVar1;
  Value *other;
  ClientRequests local_100;
  Value *local_c8;
  Value *clientValue;
  undefined1 local_b8 [8];
  Value query;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string queryFile;
  ClientQueryJson *q_local;
  string *client_local;
  cmFileAPI *this_local;
  
  queryFile.field_2._8_8_ = q;
  std::operator+(&local_80,&this->APIv1,"/query/");
  std::operator+(&local_60,&local_80,client);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,"/query.json");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  Json::Value::Value((Value *)local_b8,nullValue);
  bVar1 = ReadJsonFile(this,(string *)local_40,(Value *)local_b8,(string *)queryFile.field_2._8_8_);
  if (bVar1) {
    bVar1 = Json::Value::isObject((Value *)local_b8);
    if (bVar1) {
      local_c8 = Json::Value::operator[]((Value *)local_b8,"client");
      bVar1 = Json::Value::isNull(local_c8);
      if (!bVar1) {
        Json::Value::operator=((Value *)(queryFile.field_2._8_8_ + 0x20),local_c8);
      }
      other = Json::Value::operator[]((Value *)local_b8,"requests");
      Json::Value::operator=((Value *)(queryFile.field_2._8_8_ + 0x48),other);
      BuildClientRequests(&local_100,this,(Value *)(queryFile.field_2._8_8_ + 0x48));
      ClientRequests::operator=((ClientRequests *)(queryFile.field_2._8_8_ + 0x70),&local_100);
      ClientRequests::~ClientRequests(&local_100);
      clientValue._4_4_ = 0;
    }
    else {
      std::__cxx11::string::operator=
                ((string *)queryFile.field_2._8_8_,"query root is not an object");
      clientValue._4_4_ = 1;
    }
  }
  else {
    clientValue._4_4_ = 1;
  }
  Json::Value::~Value((Value *)local_b8);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmFileAPI::ReadClientQuery(std::string const& client, ClientQueryJson& q)
{
  // Read the query.json file.
  std::string queryFile = this->APIv1 + "/query/" + client + "/query.json";
  Json::Value query;
  if (!this->ReadJsonFile(queryFile, query, q.Error)) {
    return;
  }
  if (!query.isObject()) {
    q.Error = "query root is not an object";
    return;
  }

  Json::Value const& clientValue = query["client"];
  if (!clientValue.isNull()) {
    q.ClientValue = clientValue;
  }
  q.RequestsValue = std::move(query["requests"]);
  q.Requests = this->BuildClientRequests(q.RequestsValue);
}